

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON_TextureMapping::EvaluateBoxMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  double *pdVar2;
  double local_d8;
  ON_3dPoint local_c0;
  double local_a8;
  double shift;
  ON_3dPoint local_88;
  double local_70;
  double t1;
  double t0;
  int side1;
  int side0;
  ON_3dVector n;
  ON_3dPoint rst;
  ON_3dPoint *T_local;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_TextureMapping *this_local;
  
  ON_Xform::operator*((ON_3dPoint *)&n.z,&this->m_Pxyz,P);
  ON_Xform::operator*((ON_3dVector *)&side1,&this->m_Nxyz,N);
  ON_3dVector::Unitize((ON_3dVector *)&side1);
  t0._4_4_ = 0;
  t1 = 0.0;
  if (this->m_projection == ray_projection) {
    if ((this->m_bCapped & 1U) != 0) {
      t0._4_4_ = IntersectBoxRayHelper((ON_3dPoint *)&n.z,(ON_3dVector *)&side1,2,&t1);
    }
    t0._0_4_ = IntersectBoxRayHelper((ON_3dPoint *)&n.z,(ON_3dVector *)&side1,0,&local_70);
    if ((t0._4_4_ == 0) || (iVar1 = BestHitHelper(t1,local_70), iVar1 == 1)) {
      t0._4_4_ = t0._0_4_;
      t1 = local_70;
    }
    t0._0_4_ = IntersectBoxRayHelper((ON_3dPoint *)&n.z,(ON_3dVector *)&side1,1,&local_70);
    if ((t0._4_4_ == 0) || (iVar1 = BestHitHelper(t1,local_70), iVar1 == 1)) {
      t0._4_4_ = t0._0_4_;
      t1 = local_70;
    }
    if (t0._4_4_ != 0) {
      ::operator*((ON_3dVector *)&shift,t1,(ON_3dVector *)&side1);
      ON_3dPoint::operator+(&local_88,(ON_3dPoint *)&n.z,(ON_3dVector *)&shift);
      n.z = local_88.x;
      rst.x = local_88.y;
      rst.y = local_88.z;
    }
  }
  if (t0._4_4_ == 0) {
    t0._0_4_ = (uint)(ABS(n.z) < ABS(rst.x));
    if (((this->m_bCapped & 1U) != 0) && (ABS((&n.z)[(int)t0._0_4_]) < ABS(rst.y))) {
      t0._0_4_ = 2;
    }
    local_70 = (&n.z)[(int)t0._0_4_];
    if (0.0 <= local_70) {
      t0._4_4_ = t0._0_4_ * 2 + 2;
    }
    else {
      t0._4_4_ = t0._0_4_ * 2 + 1;
    }
    t0._0_4_ = (uint)(ABS(_side1) < ABS(n.x));
    if (((this->m_bCapped & 1U) != 0) &&
       (ABS(*(double *)(&side1 + (long)(int)t0._0_4_ * 2)) < ABS(n.y))) {
      t0._0_4_ = 2;
    }
    pdVar2 = ON_3dVector::operator[]((ON_3dVector *)&side1,t0._0_4_);
    local_70 = *pdVar2;
    if ((local_70 != 0.0) || (NAN(local_70))) {
      if (0.0 <= local_70) {
        if (0.0 < local_70) {
          t0._4_4_ = t0._0_4_ * 2 + 2;
        }
      }
      else {
        t0._4_4_ = t0._0_4_ * 2 + 1;
      }
    }
  }
  local_a8 = 0.0;
  switch(t0._4_4_) {
  case 1:
    n.z = -rst.x;
    local_a8 = 3.0;
    break;
  case 2:
    n.z = rst.x;
    local_a8 = 1.0;
    break;
  case 3:
    local_a8 = 0.0;
    break;
  case 4:
    n.z = -n.z;
    local_a8 = 2.0;
    break;
  case 5:
    n.z = -n.z;
    local_a8 = 4.0;
    break;
  case 6:
    local_a8 = 5.0;
  }
  n.z = n.z * 0.5 + 0.5;
  if (this->m_texture_space == divided) {
    local_d8 = 6.0;
    if ((this->m_bCapped & 1U) == 0) {
      local_d8 = 4.0;
    }
    n.z = (local_a8 + n.z) / local_d8;
  }
  ON_Xform::operator*(&local_c0,&this->m_uvw,(ON_3dPoint *)&n.z);
  T->x = local_c0.x;
  T->y = local_c0.y;
  T->z = local_c0.z;
  return t0._4_4_;
}

Assistant:

int ON_TextureMapping::EvaluateBoxMapping(
										   const ON_3dPoint& P,
										   const ON_3dVector& N,
										   ON_3dPoint* T
										   ) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping cylinder" into the cylinder centered at
  // rst = (0,0,0) with radius 1.0.  The axis runs
  // from rst = (0,0,-1) to rst = (0,0,+1).

  ON_3dPoint rst(m_Pxyz*P);

	ON_3dVector n(m_Nxyz*N);
  n.Unitize();

	int side0, side1;
	double t0, t1;

	side0 = 0;
	t0 = 0.0;

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)

  if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
	{

		if ( m_bCapped )
		{
			// intersect ray with top and bottom
			side0 = IntersectBoxRayHelper(rst,n,2,&t0);
		}
		// intersect ray with front and back
		side1 = IntersectBoxRayHelper(rst,n,0,&t1);
		if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
		{
			side0 = side1;
			t0 = t1;
		}
		// intersect ray with left and right
		side1 = IntersectBoxRayHelper(rst,n,1,&t1);
		if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
		{
			side0 = side1;
			t0 = t1;
		}
		if ( 0 != side0 )
		{
			// ray hit the box
			rst = rst + t0*n;
		}
	}

  if ( 0 == side0 )
  {
    // set side0 = side closest to the point
    side1 = (fabs(rst.x) >= fabs(rst.y)) ? 0 : 1;
    if ( m_bCapped && fabs(rst.z) > fabs(((double*)&rst.x)[side1]) )
      side1 = 2;
    t1 = (&rst.x)[side1];
    if ( t1 < 0.0 )
    {
      side0 = 2*side1 + 1;
    }
    else
    {
      side0 = 2*side1 + 2;
    }

    //if ( fabs(t1) <= 1.0+ON_SQRT_EPSILON )...
    //// The point is inside the box.  If the normal
    //// is not zero, then use it to choose the side
    //// used for the closest point projection.

    side1 = ( fabs(n.x) >= fabs(n.y) ) ? 0 : 1;
    if ( m_bCapped && fabs(n.z) > fabs((&n.x)[side1]))
    {
      side1 = 2;
    }
    t1 = n[side1];
    if ( 0.0 != t1 )
    {
      if ( t1 < 0.0 )
        side0 = 2*side1 + 1;
      else if ( t1 > 0.0 )
        side0 = 2*side1 + 2;
    }
  }

	double shift = 0.0;

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)

	switch(side0)
	{
	case 1: // x = -1
		rst.x = -rst.y;
		rst.y =  rst.z;
		shift =  3.0;
		break;
	case 2: // x = +1
		rst.x =  rst.y;
		rst.y =  rst.z;
		shift =  1.0;
		break;
	case 3: // y = -1
		rst.y =  rst.z;
		shift =  0.0;
		break;
	case 4: // y = +1
		rst.x = -rst.x;
		rst.y =  rst.z;
		shift =  2.0;
		break;
	case 5: // z = -1
		rst.x = -rst.x;
		shift =  4.0;
		break;
	case 6: // z = +1
		shift =  5.0;
		break;
	}

  // normalize texture coordinates
  rst.x = 0.5*rst.x + 0.5;
  rst.y = 0.5*rst.y + 0.5;
	rst.z = 0.0;

	if( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space)
	{
    rst.x = (shift + rst.x)/(m_bCapped ? 6.0 : 4.0);
	}

	*T = m_uvw*rst;

  return side0;
}